

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDeferredTestReporter.cpp
# Opt level: O3

void __thiscall
UnitTest::anon_unknown_0::
TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures::
~TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures
          (TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures *this)

{
  Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(DeferredTestReporterFixture, ReportFailureSavesFailureDetailsForMultipleFailures)
{
    char const* failure1 = "failure 1";
    char const* failure2 = "failure 2";

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, failure1);
    reporter.ReportFailure(details, failure2);

    DeferredTestResult const& result = reporter.GetResults().at(0);
    CHECK_EQUAL(2, (int)result.failures.size());
    CHECK_EQUAL(failure1, result.failures[0].second);
    CHECK_EQUAL(failure2, result.failures[1].second);
}